

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall
JsrtDebugManager::ReportExceptionBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  Utf8SourceInfo *utf8SourceInfo;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  DynamicObject *object;
  DebugContext *pDVar6;
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar7;
  JsrtDebuggerObjectBase *pJVar8;
  undefined4 extraout_var;
  Var value;
  ResolvedObject local_90;
  undefined1 local_50 [8];
  JsrtDebugEventObject debugEventObject;
  BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> local_38;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    debugEventObject.scriptContext = (ScriptContext *)this;
    if (haltState->stopType != STOP_EXCEPTIONTHROW) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x12d,"(haltState->stopType == Js::STOP_EXCEPTIONTHROW)",
                         "haltState->stopType == Js::STOP_EXCEPTIONTHROW");
      if (!bVar2) goto LAB_003a71a9;
      *puVar4 = 0;
    }
    pFVar5 = Js::InterpreterHaltState::GetFunction(haltState);
    utf8SourceInfo = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
    JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)local_50,scriptContext);
    object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_50);
    JsrtDebugUtils::AddScriptIdToObject(object,utf8SourceInfo);
    pFVar5 = Js::DiagStackFrame::GetFunction(haltState->topFrame);
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x13c,"(functionBody != nullptr)","functionBody != nullptr");
      if (!bVar2) goto LAB_003a71a9;
      *puVar4 = 0;
    }
    iVar3 = (*haltState->topFrame->_vptr_DiagStackFrame[3])();
    JsrtDebugUtils::AddLineColumnToObject(object,pFVar5,iVar3);
    JsrtDebugUtils::AddSourceLengthAndTextToObject(object,pFVar5,iVar3);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0x22,(haltState->exceptionObject->field_0x14 & 0x10) == 0
               ,scriptContext);
    pDVar6 = Js::ScriptContext::GetDebugContext(scriptContext);
    local_90.obj = pDVar6->diagProbesContainer->jsExceptionObject;
    if ((RecyclableObject *)local_90.obj == (RecyclableObject *)0x0) {
      local_90.obj = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    debuggerObjectsManager =
         GetDebuggerObjectsManager((JsrtDebugManager *)debugEventObject.scriptContext);
    local_90.propId = -1;
    local_90.address = (IDiagObjectAddress *)0x0;
    local_90.objectDisplay = (IDiagObjectModelDisplay *)0x0;
    local_90.originalObj = (Var)0x0;
    local_90.name = L"{exception}";
    local_90.typeId = TypeIds_Error;
    local_90.isConst = false;
    local_90.scriptContext = scriptContext;
    local_38.ptr = Js::ResolvedObject::GetObjectDisplay(&local_90);
    pWVar7 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                       (&local_38);
    bVar2 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar7->adapter);
    if (bVar2 && pWVar7->p != (IDiagObjectModelDisplay *)0x0) {
      pJVar8 = JsrtDebuggerObjectProperty::Make(debuggerObjectsManager,local_38.ptr);
      iVar3 = (*pJVar8->_vptr_JsrtDebuggerObjectBase[2])(pJVar8,local_90.scriptContext,0);
      if ((Var)CONCAT44(extraout_var,iVar3) == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.h"
                           ,0x2a,"(object != nullptr)","object != nullptr");
        if (!bVar2) {
LAB_003a71a9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      value = Js::CrossSite::MarshalVar(scriptContext,(Var)CONCAT44(extraout_var,iVar3),false);
      JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x7,value,scriptContext);
      local_38.ptr = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0;
    }
    AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
    ~AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
              *)&local_38);
    CallDebugEventCallbackForBreak
              ((JsrtDebugManager *)debugEventObject.scriptContext,JsDiagDebugEventRuntimeException,
               object,scriptContext);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)local_50);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportExceptionBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Assert(haltState->stopType == Js::STOP_EXCEPTIONTHROW);

        Js::Utf8SourceInfo* utf8SourceInfo = haltState->GetFunction()->GetUtf8SourceInfo();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = JsDiagDebugEventRuntimeException;

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);

        Js::FunctionBody* functionBody = haltState->topFrame->GetFunction();

        Assert(functionBody != nullptr);
        
        int currentByteCodeOffset = haltState->topFrame->GetByteCodeOffset();
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::uncaught, !haltState->exceptionObject->IsFirstChanceException(), scriptContext);

        Js::ResolvedObject resolvedObject;
        resolvedObject.scriptContext = scriptContext;
        resolvedObject.name = _u("{exception}");
        resolvedObject.typeId = Js::TypeIds_Error;
        resolvedObject.address = nullptr;
        resolvedObject.obj = scriptContext->GetDebugContext()->GetProbeContainer()->GetExceptionObject();

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.obj = resolvedObject.scriptContext->GetLibrary()->GetUndefined();
        }

        JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->GetDebuggerObjectsManager(), resolvedObject, scriptContext, /* forceSetValueProp */ false, [&](Js::Var marshaledObj)
        {
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::exception, marshaledObj, scriptContext);
        });
        
        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}